

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsModelUtils.cpp
# Opt level: O1

void writePrimalSolution(FILE *file,HighsLogOptions *log_options,HighsLp *lp,
                        vector<double,_std::allocator<double>_> *primal_solution,bool sparse)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  double dVar2;
  pointer pbVar3;
  long lVar4;
  long lVar5;
  undefined3 in_register_00000081;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  string name;
  array<char,_32UL> valStr;
  stringstream ss;
  string local_248;
  FILE *local_228;
  vector<double,_std::allocator<double>_> *local_220;
  undefined1 *local_218;
  undefined8 local_210;
  undefined1 local_208 [16];
  string local_1f8;
  HighsLogOptions *local_1d8;
  HighsLp *local_1d0;
  pointer local_1c8;
  pointer local_1c0;
  stringstream local_1b8 [16];
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  iVar6 = 0;
  if ((CONCAT31(in_register_00000081,sparse) != 0) && (iVar6 = 0, 0 < (long)lp->num_col_)) {
    lVar5 = 0;
    iVar6 = 0;
    do {
      iVar6 = iVar6 + (uint)((primal_solution->super__Vector_base<double,_std::allocator<double>_>).
                             _M_impl.super__Vector_impl_data._M_start[lVar5] != 0.0);
      lVar5 = lVar5 + 1;
    } while (lp->num_col_ != lVar5);
  }
  local_1c0 = (lp->col_names_).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_1c8 = (lp->col_names_).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  local_228 = (FILE *)file;
  local_220 = primal_solution;
  local_1d8 = log_options;
  std::__cxx11::stringstream::stringstream(local_1b8);
  paVar1 = &local_1f8.field_2;
  local_1f8._M_string_length = 0;
  local_1f8.field_2._M_local_buf[0] = '\0';
  local_1f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::stringbuf::str((string *)(local_1a8 + 8));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1f8._M_dataplus._M_p);
  }
  if (sparse) {
    uVar7 = -iVar6;
  }
  else {
    uVar7 = lp->num_col_;
  }
  highsFormatToString_abi_cxx11_(&local_1f8,"# Columns %d\n",(ulong)uVar7);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,local_1f8._M_dataplus._M_p,local_1f8._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1f8._M_dataplus._M_p);
  }
  std::__cxx11::stringbuf::str();
  highsFprintfString((FILE *)local_228,local_1d8,&local_1f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1f8._M_dataplus._M_p);
  }
  local_1d0 = lp;
  if (0 < lp->num_col_) {
    paVar1 = &local_248.field_2;
    lVar5 = 8;
    uVar8 = 0;
    do {
      if (((!sparse) ||
          (dVar2 = (local_220->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start[uVar8], dVar2 != 0.0)) || (NAN(dVar2))) {
        highsDoubleToString((array<char,_32UL> *)&local_1f8,
                            (local_220->super__Vector_base<double,_std::allocator<double>_>)._M_impl
                            .super__Vector_impl_data._M_start[uVar8],1e-13);
        local_210 = 0;
        local_208[0] = 0;
        local_218 = local_208;
        std::__cxx11::stringbuf::str((string *)(local_1a8 + 8));
        if (local_218 != local_208) {
          operator_delete(local_218);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"C",1);
        std::ostream::operator<<((ostream *)local_1a8,(int)uVar8);
        if (local_1c8 == local_1c0) {
          std::__cxx11::stringbuf::str();
        }
        else {
          pbVar3 = (local_1d0->col_names_).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_218 = local_208;
          lVar4 = *(long *)((long)pbVar3 + lVar5 + -8);
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_218,lVar4,
                     *(long *)((long)&(pbVar3->_M_dataplus)._M_p + lVar5) + lVar4);
        }
        local_248._M_string_length = 0;
        local_248.field_2._M_local_buf[0] = '\0';
        local_248._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::stringbuf::str((string *)(local_1a8 + 8));
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_248._M_dataplus._M_p != paVar1) {
          operator_delete(local_248._M_dataplus._M_p);
        }
        highsFormatToString_abi_cxx11_(&local_248,"%-s %s",local_218,&local_1f8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,local_248._M_dataplus._M_p,local_248._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_248._M_dataplus._M_p != paVar1) {
          operator_delete(local_248._M_dataplus._M_p);
        }
        if (sparse) {
          highsFormatToString_abi_cxx11_(&local_248," %d",uVar8 & 0xffffffff);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,local_248._M_dataplus._M_p,local_248._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_248._M_dataplus._M_p != paVar1) {
            operator_delete(local_248._M_dataplus._M_p);
          }
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
        std::__cxx11::stringbuf::str();
        highsFprintfString((FILE *)local_228,local_1d8,&local_248);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_248._M_dataplus._M_p != paVar1) {
          operator_delete(local_248._M_dataplus._M_p);
        }
        if (local_218 != local_208) {
          operator_delete(local_218);
        }
      }
      uVar8 = uVar8 + 1;
      lVar5 = lVar5 + 0x20;
    } while ((long)uVar8 < (long)local_1d0->num_col_);
  }
  fflush(local_228);
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void writePrimalSolution(FILE* file, const HighsLogOptions& log_options,
                         const HighsLp& lp,
                         const std::vector<double>& primal_solution,
                         const bool sparse) {
  HighsInt num_nonzero_primal_value = 0;
  const bool have_col_names = lp.col_names_.size() > 0;
  if (sparse) {
    // Determine the number of nonzero primal solution values
    for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++)
      if (primal_solution[iCol]) num_nonzero_primal_value++;
  }
  // Indicate the number of column values to be written out, depending
  // on whether format is sparse: either lp.num_col_ if not sparse, or
  // the negation of the number of nonzero values, if sparse

  std::stringstream ss;
  ss.str(std::string());
  ss << highsFormatToString("# Columns %" HIGHSINT_FORMAT "\n",
                            sparse ? -num_nonzero_primal_value : lp.num_col_);
  highsFprintfString(file, log_options, ss.str());
  for (HighsInt ix = 0; ix < lp.num_col_; ix++) {
    if (sparse && !primal_solution[ix]) continue;
    auto valStr = highsDoubleToString(primal_solution[ix],
                                      kHighsSolutionValueToStringTolerance);
    // Create a column name
    ss.str(std::string());
    ss << "C" << ix;
    const std::string name = have_col_names ? lp.col_names_[ix] : ss.str();
    ss.str(std::string());
    ss << highsFormatToString("%-s %s", name.c_str(), valStr.data());
    if (sparse) ss << highsFormatToString(" %d", int(ix));
    ss << "\n";
    highsFprintfString(file, log_options, ss.str());
  }
  fflush(file);
}